

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O1

void cpp_bindgen::_impl::add_entity<cpp_bindgen::_impl::c_bindings_traits,void(),char_const*&>
               (char *name,char **params)

{
  char *pcVar1;
  entities *this;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this = get_entities<cpp_bindgen::_impl::c_bindings_traits>();
  pcVar1 = *params;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = operator_new(0x10);
  *(code **)local_48._M_unused._0_8_ = c_bindings_traits::generate_entity<void()>;
  *(char **)((long)local_48._M_unused._0_8_ + 8) = pcVar1;
  pcStack_30 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*),_std::_Bind<void_(*(std::_Placeholder<1>,_const_char_*))(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*)>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*),_std::_Bind<void_(*(std::_Placeholder<1>,_const_char_*))(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*)>_>
             ::_M_manager;
  entities::add(this,name,(generator_t *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void add_entity(const char *name, Params &&... params) {
            get_entities<Traits>().add(name,
                std::bind(Traits::template generate_entity<Signature>,
                    std::placeholders::_1,
                    std::forward<Params>(params)...));
        }